

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPUDetailsWidget.cpp
# Opt level: O3

bool __thiscall GPUDetailsWidget::event(GPUDetailsWidget *this,QEvent *event)

{
  undefined1 uVar1;
  long lVar2;
  QArrayData *local_58;
  undefined8 uStack_50;
  long local_48;
  QRect local_38;
  QPoint local_20;
  
  if (*(short *)(event + 8) != 0x6e) {
    uVar1 = QWidget::event((QEvent *)this);
    return (bool)uVar1;
  }
  lVar2 = QWidget::childAt((QPoint *)this);
  if (lVar2 != 0) {
    QWidget::toolTip();
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,8);
      }
    }
    if (local_48 != 0) {
      QWidget::toolTip();
      local_38.x1 = 0;
      local_38.y1 = 0;
      local_38.x2 = -1;
      local_38.y2 = -1;
      QToolTip::showText((QPoint *)(event + 0x18),(QString *)&local_58,(QWidget *)0x0,&local_38,-1);
      if (local_58 == (QArrayData *)0x0) {
        return true;
      }
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i != 0) {
        return true;
      }
      QArrayData::deallocate(local_58,2,8);
      return true;
    }
  }
  local_20.xp = 0;
  local_20.yp = 0;
  local_48 = 0;
  local_58 = (QArrayData *)0x0;
  uStack_50 = 0;
  local_38.x1 = 0;
  local_38.y1 = 0;
  local_38.x2 = -1;
  local_38.y2 = -1;
  QToolTip::showText(&local_20,(QString *)&local_58,(QWidget *)0x0,&local_38,-1);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  event[0xc] = (QEvent)0x0;
  return true;
}

Assistant:

bool GPUDetailsWidget::event(QEvent *event) {
    if (event->type() == QEvent::ToolTip) {
        auto helpEvent = static_cast<QHelpEvent*>(event);

        if (auto child = childAt(helpEvent->pos()); child && !child->toolTip().isEmpty()) {
            QToolTip::showText(helpEvent->globalPos(), child->toolTip());
            return true;
        }

        QToolTip::hideText();
        event->ignore();

        return true;
    }

    return QWidget::event(event);
}